

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<Indexing::CodeTree::MatchInfo_*>::~DArray(DArray<Indexing::CodeTree::MatchInfo_*> *this)

{
  MatchInfo **ppMVar1;
  ulong uVar2;
  
  ppMVar1 = this->_array;
  if (ppMVar1 != (MatchInfo **)0x0) {
    uVar2 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *ppMVar1 = (MatchInfo *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppMVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *ppMVar1 = (MatchInfo *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppMVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *ppMVar1 = (MatchInfo *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppMVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *ppMVar1 = (MatchInfo *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppMVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *ppMVar1 = (MatchInfo *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppMVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(ppMVar1,0x10);
      return;
    }
    *ppMVar1 = (MatchInfo *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppMVar1;
  }
  return;
}

Assistant:

inline ~DArray()
  {
    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
  }